

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

GVariant * greetable_skeleton_dbus_interface_get_properties(GDBusInterfaceSkeleton *_skeleton)

{
  GDBusPropertyInfo *pGVar1;
  GType GVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  GDBusConnection *connection;
  gchar *object_path;
  GVariant *pGVar5;
  GVariant *value;
  GDBusPropertyInfo *info;
  undefined1 local_98 [4];
  guint n;
  GVariantBuilder builder;
  GreetableSkeleton *skeleton;
  GDBusInterfaceSkeleton *_skeleton_local;
  
  GVar2 = greetable_skeleton_get_type();
  builder.u.s.y[0xd] = g_type_check_instance_cast(_skeleton,GVar2);
  uVar3 = g_variant_type_checked_("a{sv}");
  g_variant_builder_init(local_98,uVar3);
  for (info._4_4_ = 0; uVar3 = builder.u.s.y[0xd],
      _greetable_property_info_pointers[info._4_4_] != (GDBusPropertyInfo *)0x0;
      info._4_4_ = info._4_4_ + 1) {
    pGVar1 = _greetable_property_info_pointers[info._4_4_];
    if ((pGVar1->flags & G_DBUS_PROPERTY_INFO_FLAGS_READABLE) != G_DBUS_PROPERTY_INFO_FLAGS_NONE) {
      uVar4 = g_dbus_interface_skeleton_get_type();
      uVar3 = g_type_check_instance_cast(uVar3,uVar4);
      connection = (GDBusConnection *)g_dbus_interface_skeleton_get_connection(uVar3);
      uVar3 = builder.u.s.y[0xd];
      uVar4 = g_dbus_interface_skeleton_get_type();
      uVar3 = g_type_check_instance_cast(uVar3,uVar4);
      object_path = (gchar *)g_dbus_interface_skeleton_get_object_path(uVar3);
      pGVar5 = _greetable_skeleton_handle_get_property
                         (connection,(gchar *)0x0,object_path,"io.mangoh.Testing.Greetable",
                          pGVar1->name,(GError **)0x0,(gpointer)builder.u.s.y[0xd]);
      if (pGVar5 != (GVariant *)0x0) {
        g_variant_take_ref(pGVar5);
        g_variant_builder_add(local_98,"{sv}",pGVar1->name,pGVar5);
        g_variant_unref(pGVar5);
      }
    }
  }
  pGVar5 = (GVariant *)g_variant_builder_end(local_98);
  return pGVar5;
}

Assistant:

static GVariant *
greetable_skeleton_dbus_interface_get_properties (GDBusInterfaceSkeleton *_skeleton)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (_skeleton);

  GVariantBuilder builder;
  guint n;
  g_variant_builder_init (&builder, G_VARIANT_TYPE ("a{sv}"));
  if (_greetable_interface_info.parent_struct.properties == NULL)
    goto out;
  for (n = 0; _greetable_interface_info.parent_struct.properties[n] != NULL; n++)
    {
      GDBusPropertyInfo *info = _greetable_interface_info.parent_struct.properties[n];
      if (info->flags & G_DBUS_PROPERTY_INFO_FLAGS_READABLE)
        {
          GVariant *value;
          value = _greetable_skeleton_handle_get_property (g_dbus_interface_skeleton_get_connection (G_DBUS_INTERFACE_SKELETON (skeleton)), NULL, g_dbus_interface_skeleton_get_object_path (G_DBUS_INTERFACE_SKELETON (skeleton)), "io.mangoh.Testing.Greetable", info->name, NULL, skeleton);
          if (value != NULL)
            {
              g_variant_take_ref (value);
              g_variant_builder_add (&builder, "{sv}", info->name, value);
              g_variant_unref (value);
            }
        }
    }
out:
  return g_variant_builder_end (&builder);
}